

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::bit<(unsigned_char)1,(SM83::Registers)2>(SM83 *this)

{
  undefined8 in_RAX;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_char,_char>
  fmt;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x48;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_char,char>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  BIT {}, {}\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)&stack0xffffffffffffffef,&stack0xffffffffffffffee
             ,(char *)CONCAT17(1,CONCAT16(0x42,(int6)in_RAX)));
  (this->field_0).field_1.f =
       (((this->field_1).field_1.b & 2) << 6 | (this->field_0).field_1.f & 0x1f) ^ 0xa0;
  return;
}

Assistant:

void SM83::bit() {
    LTRACE("BIT {}, {}", Bit, Get8bitRegisterName<Register>());
    const u8 reg = Get8bitRegister<Register>();

    SetZeroFlag(!Common::IsBitSet<Bit>(reg));
    SetNegateFlag(false);
    SetHalfCarryFlag(true);
}